

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O2

LinkedToken * __thiscall Linker::searchForLink(Linker *this,Token *token)

{
  string *this_00;
  const_iterator cVar1;
  LinkedToken *pLVar2;
  LinkedToken local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Token local_b8;
  undefined1 local_90 [8];
  LinkedToken linkedToken;
  string link;
  
  linkedToken.link.field_2._8_8_ = &link._M_string_length;
  link._M_dataplus._M_p = (pointer)0x0;
  link._M_string_length._0_1_ = 0;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->namespaceLinks)._M_t,&token->content);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->namespaceLinks)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::_M_assign((string *)(linkedToken.link.field_2._M_local_buf + 8));
  }
  if (link._M_dataplus._M_p == (pointer)0x0) {
    SymbolIndexSearch::operator()[abi_cxx11_((string *)local_90,&this->symbolSearch,token);
    this_00 = (string *)(linkedToken.link.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=(this_00,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    if (link._M_dataplus._M_p == (pointer)0x0) {
      EngineSearch::operator()[abi_cxx11_((string *)local_90,&this->engineSearch,token);
      std::__cxx11::string::operator=(this_00,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      if (link._M_dataplus._M_p == (pointer)0x0) {
        HeaderSearch::operator()[abi_cxx11_((string *)local_90,&this->headerSearch,token);
        std::__cxx11::string::operator=(this_00,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        if (link._M_dataplus._M_p == (pointer)0x0) {
          pLVar2 = (LinkedToken *)0x0;
          goto LAB_00182e35;
        }
      }
    }
  }
  Token::Token(&local_b8,token);
  std::operator+(&local_d8,"https://en.cppreference.com",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkedToken.link.field_2 + 8));
  LinkedToken::LinkedToken((LinkedToken *)local_90,&local_b8,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  LinkedToken::LinkedToken(&local_120,(LinkedToken *)local_90);
  pLVar2 = Cache<LinkedToken>::add(&this->tokenCache,&local_120);
  LinkedToken::~LinkedToken(&local_120);
  LinkedToken::~LinkedToken((LinkedToken *)local_90);
LAB_00182e35:
  std::__cxx11::string::~string((string *)(linkedToken.link.field_2._M_local_buf + 8));
  return pLVar2;
}

Assistant:

LinkedToken* searchForLink(const Token& token) {
			std::string link;

			const auto namespaceLink = namespaceLinks.find(token.content);
			if (namespaceLink != namespaceLinks.end()) {
				link = namespaceLink->second;
			}

			if (link.empty()) {
				link = symbolSearch(token);
			}

			if (link.empty()) {
				link = engineSearch(token);
			}

			if (link.empty()) {
				link = headerSearch(token);
			}

			if (link.empty()) {
				return nullptr;
			}

			LinkedToken linkedToken(token, "https://en.cppreference.com" + link);
			return tokenCache.add(std::move(linkedToken));
		}